

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall Board::Board(Board *this,Board *board)

{
  int local_20;
  int local_1c;
  int j;
  int i;
  Board *board_local;
  Board *this_local;
  
  memcpy(this,&DAT_0011b41c,0x90);
  std::__cxx11::string::string((string *)&this->identifier);
  std::__cxx11::string::string((string *)&this->referrer);
  std::vector<Block,_std::allocator<Block>_>::vector(&this->blocks);
  for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
      this->cells[local_1c][local_20] = board->cells[local_1c][local_20];
    }
  }
  std::__cxx11::string::operator=((string *)&this->identifier,(string *)&board->identifier);
  std::__cxx11::string::operator=((string *)&this->referrer,(string *)&board->referrer);
  std::vector<Block,_std::allocator<Block>_>::operator=(&this->blocks,&board->blocks);
  return;
}

Assistant:

Board::Board(const Board &board) {

    for (int i = 0; i < BOARD_SIZE; ++i) {
        for (int j = 0; j < BOARD_SIZE; ++j) {
            this->cells[i][j] = board.cells[i][j];
        }
    }
    this->identifier = board.identifier;
    this->referrer = board.referrer;
    this->blocks = board.blocks;
}